

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_rtree.cpp
# Opt level: O3

bool SearchHelper(ON_RTreeNode *a_node,ON_RTreeSphere *a_sphere,
                 ON_RTreeSearchResultCallback *a_result)

{
  double dVar1;
  double dVar2;
  double dVar3;
  bool bVar4;
  ulong uVar5;
  double *pdVar6;
  ulong uVar7;
  anon_union_8_2_fca59aa2_for_ON_RTreeBranch_1 *paVar8;
  ulong uVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double r [6];
  double local_68 [7];
  
  uVar9 = (ulong)a_node->m_count;
  if ((long)uVar9 < 1) {
    return true;
  }
  dVar1 = a_sphere->m_point[0];
  dVar2 = a_sphere->m_radius;
  pdVar6 = a_node->m_branch[0].m_rect.m_max + 2;
  uVar5 = 0xffffffff;
  uVar7 = 0;
  dVar3 = dVar2;
  do {
    if (((ON_RTreeBBox *)(pdVar6 + -5))->m_min[0] <= dVar1) {
      dVar13 = 0.0;
      if (pdVar6[-2] < dVar1) {
        dVar12 = dVar1 - pdVar6[-2];
        goto LAB_005a6609;
      }
LAB_005a6619:
      dVar11 = a_sphere->m_point[1];
      dVar10 = dVar13;
      if (pdVar6[-4] <= dVar11) {
        dVar12 = 0.0;
        if (pdVar6[-1] < dVar11) {
          dVar12 = dVar11 - pdVar6[-1];
          if (dVar2 < dVar12) goto LAB_005a672c;
          dVar11 = dVar12;
          if (dVar13 < dVar12) goto LAB_005a6689;
        }
LAB_005a6684:
        dVar10 = dVar12;
        dVar11 = dVar13;
      }
      else {
        dVar12 = pdVar6[-4] - dVar11;
        if (dVar2 < dVar12) goto LAB_005a672c;
        dVar11 = dVar12;
        if (dVar12 <= dVar13) goto LAB_005a6684;
      }
LAB_005a6689:
      dVar12 = a_sphere->m_point[2];
      if (pdVar6[-3] <= dVar12) {
        dVar13 = 0.0;
        if (*pdVar6 < dVar12) {
          dVar12 = dVar12 - *pdVar6;
          if (dVar2 < dVar12) goto LAB_005a672c;
          dVar13 = dVar12;
          if (dVar11 < dVar12) goto LAB_005a66f5;
        }
LAB_005a66f0:
        dVar12 = dVar11;
        dVar11 = dVar13;
      }
      else {
        dVar12 = pdVar6[-3] - dVar12;
        if (dVar2 < dVar12) goto LAB_005a672c;
        dVar13 = dVar12;
        if (dVar12 <= dVar11) goto LAB_005a66f0;
      }
LAB_005a66f5:
      if (0.0 < dVar12) {
        dVar12 = SQRT((dVar11 / dVar12) * (dVar11 / dVar12) +
                      (dVar10 / dVar12) * (dVar10 / dVar12) + 1.0) * dVar12;
      }
    }
    else {
      dVar12 = ((ON_RTreeBBox *)(pdVar6 + -5))->m_min[0] - dVar1;
LAB_005a6609:
      dVar13 = dVar12;
      if (dVar12 <= dVar2) goto LAB_005a6619;
    }
LAB_005a672c:
    local_68[uVar7] = dVar12;
    if (dVar12 <= dVar3) {
      uVar5 = uVar7 & 0xffffffff;
    }
    dVar3 = (double)((ulong)dVar3 & -(ulong)(dVar3 < dVar12) |
                    ~-(ulong)(dVar3 < dVar12) & (ulong)dVar12);
    uVar7 = uVar7 + 1;
    pdVar6 = pdVar6 + 7;
    if (uVar9 == uVar7) {
      if ((int)uVar5 < 0) {
        return true;
      }
      if (a_node->m_level < 1) {
        bVar4 = (*a_result->m_resultCallback)
                          (a_result->m_context,(ON__INT_PTR)a_node->m_branch[uVar5].field_1.m_child)
        ;
        if (!bVar4) {
          return false;
        }
        paVar8 = &a_node->m_branch[0].field_1;
        uVar7 = 0;
        do {
          if (((uVar5 != uVar7) && (local_68[uVar7] <= a_sphere->m_radius)) &&
             (bVar4 = (*a_result->m_resultCallback)
                                (a_result->m_context,(ON__INT_PTR)paVar8->m_child), !bVar4)) {
            return false;
          }
          uVar7 = uVar7 + 1;
          paVar8 = paVar8 + 7;
        } while (uVar9 != uVar7);
      }
      else {
        bVar4 = SearchHelper(a_node->m_branch[uVar5].field_1.m_child,a_sphere,a_result);
        if (!bVar4) {
          return false;
        }
        paVar8 = &a_node->m_branch[0].field_1;
        uVar7 = 0;
        do {
          if (((uVar5 != uVar7) && (local_68[uVar7] <= a_sphere->m_radius)) &&
             (bVar4 = SearchHelper(paVar8->m_child,a_sphere,a_result), !bVar4)) {
            return false;
          }
          uVar7 = uVar7 + 1;
          paVar8 = paVar8 + 7;
        } while (uVar9 != uVar7);
      }
      return true;
    }
  } while( true );
}

Assistant:

static
bool SearchHelper(const ON_RTreeNode* a_node, struct ON_RTreeSphere* a_sphere, ON_RTreeSearchResultCallback& a_result ) 
{
  // NOTE: 
  //  Some versions of ON_RTree::Search shrink a_sphere as the search progresses.
  int i, closest_i, count;
  const double* sphere_center;
  const ON_RTreeBranch* branch;
  double r[ON_RTree_MAX_NODE_COUNT], sphere_radius, closest_d;
  
  if ( (count = a_node->m_count) > 0 )
  {
    branch = a_node->m_branch;
    sphere_center = a_sphere->m_point;
    sphere_radius = a_sphere->m_radius;
    closest_i = -1;
    closest_d = sphere_radius;

    for( i = 0; i < count; ++i )
    {
      // The radius parameter passed to DistanceToBoxHelper()
      // needs to be sphere_radius and not closest_d in order 
      // for the for() loops below to work correctly.
      r[i] = DistanceToBoxHelper( sphere_center, sphere_radius, &branch[i].m_rect );
      if ( r[i] <= closest_d )
      {
        closest_d = r[i];
        closest_i = i;
      }
    }

    // If all of the branches rectangles do not intersect the sphere,
    // then closest_i = -1.
    if ( closest_i >= 0 )
    {
      if(a_node->IsInternalNode()) 
      {
        // a_node is an internal node - search m_branch[].m_child as needed.
        // Search a closer node first to avoid worst case search times
        // in calculations where the calls to a_result.m_resultCallback()
        // reduce a_sphere->m_radius as results are found.  Closest point
        // calculations are an example.
        if ( !SearchHelper(branch[closest_i].m_child, a_sphere, a_result) )
        {
          // callback canceled search
          return false;
        }

        for( i = 0; i < count; ++i )
        {
          // Note that the calls to SearchHelper() can reduce the
          // value of a_sphere->m_radius.
          if( i != closest_i && r[i] <= a_sphere->m_radius )
          {
            if(!SearchHelper(branch[i].m_child, a_sphere, a_result) )
            {
              return false; // Don't continue searching
            }
          }
        }
      }
      else
      {
        // a_node is a leaf node - return m_branch[].m_id values
        // Search a closer node first to avoid worst case search times
        // in calculations where the calls to a_result.m_resultCallback()
        // reduce a_sphere->m_radius as results are found.  Closest point
        // calculations are an example.
        if ( !a_result.m_resultCallback( a_result.m_context, branch[closest_i].m_id ) ) 
        {
          // callback canceled search
          return false;
        }

        for( i = 0; i < count; ++i)
        {
          // Note that the calls to a_result.m_resultCallback() can reduce
          // the value of a_sphere->m_radius.
          if( i != closest_i && r[i] <= a_sphere->m_radius )
          {
            if ( !a_result.m_resultCallback( a_result.m_context, branch[i].m_id ) )
            {
              // callback canceled search
              return false;
            }
          }
        }
      }
    }
  }

  return true; // Continue searching
}